

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

exr_result_t
internal_exr_validate_shared_attrs
          (exr_context_t ctxt,exr_priv_part_t basepart,exr_priv_part_t curpart,int curpartidx,
          char **mismatchattr,int *mismatchcount)

{
  exr_attribute_t *peVar1;
  exr_attribute_t *peVar2;
  exr_attr_box2i_t *peVar3;
  exr_attr_box2i_t *peVar4;
  exr_result_t eVar5;
  exr_result_t eVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  exr_attribute_t *cattr;
  exr_attribute_t *battr;
  int *local_38;
  
  peVar1 = basepart->displayWindow;
  peVar2 = curpart->displayWindow;
  if (peVar1 == (exr_attribute_t *)0x0) {
    if (peVar2 != (exr_attribute_t *)0x0) goto LAB_0012ba14;
LAB_0012ba0b:
    uVar9 = 0;
  }
  else {
    if (((peVar2 != (exr_attribute_t *)0x0) && (peVar1->type == EXR_ATTR_BOX2I)) &&
       (peVar2->type == EXR_ATTR_BOX2I)) {
      peVar3 = (peVar1->field_6).box2i;
      peVar4 = (peVar2->field_6).box2i;
      auVar10[0] = -((char)(peVar3->min).x == (char)(peVar4->min).x);
      auVar10[1] = -(*(char *)((long)&(peVar3->min).x + 1) == *(char *)((long)&(peVar4->min).x + 1))
      ;
      auVar10[2] = -(*(char *)((long)&(peVar3->min).x + 2) == *(char *)((long)&(peVar4->min).x + 2))
      ;
      auVar10[3] = -(*(char *)((long)&(peVar3->min).x + 3) == *(char *)((long)&(peVar4->min).x + 3))
      ;
      auVar10[4] = -((char)(peVar3->min).y == (char)(peVar4->min).y);
      auVar10[5] = -(*(char *)((long)&(peVar3->min).y + 1) == *(char *)((long)&(peVar4->min).y + 1))
      ;
      auVar10[6] = -(*(char *)((long)&(peVar3->min).y + 2) == *(char *)((long)&(peVar4->min).y + 2))
      ;
      auVar10[7] = -(*(char *)((long)&(peVar3->min).y + 3) == *(char *)((long)&(peVar4->min).y + 3))
      ;
      auVar10[8] = -((char)(peVar3->max).x == (char)(peVar4->max).x);
      auVar10[9] = -(*(char *)((long)&(peVar3->max).x + 1) == *(char *)((long)&(peVar4->max).x + 1))
      ;
      auVar10[10] = -(*(char *)((long)&(peVar3->max).x + 2) == *(char *)((long)&(peVar4->max).x + 2)
                     );
      auVar10[0xb] = -(*(char *)((long)&(peVar3->max).x + 3) ==
                      *(char *)((long)&(peVar4->max).x + 3));
      auVar10[0xc] = -((char)(peVar3->max).y == (char)(peVar4->max).y);
      auVar10[0xd] = -(*(char *)((long)&(peVar3->max).y + 1) ==
                      *(char *)((long)&(peVar4->max).y + 1));
      auVar10[0xe] = -(*(char *)((long)&(peVar3->max).y + 2) ==
                      *(char *)((long)&(peVar4->max).y + 2));
      auVar10[0xf] = -(*(char *)((long)&(peVar3->max).y + 3) ==
                      *(char *)((long)&(peVar4->max).y + 3));
      if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar10[0xf] >> 7) << 0xf) == 0xffff) goto LAB_0012ba0b;
    }
LAB_0012ba14:
    *mismatchattr = "displayWindow";
    uVar9 = 1;
  }
  peVar1 = basepart->pixelAspectRatio;
  peVar2 = curpart->pixelAspectRatio;
  if (peVar1 == (exr_attribute_t *)0x0) {
    if (peVar2 != (exr_attribute_t *)0x0) goto LAB_0012ba4e;
  }
  else if (((peVar2 == (exr_attribute_t *)0x0) || (peVar1->type != EXR_ATTR_FLOAT)) ||
          ((peVar2->type != EXR_ATTR_FLOAT || ((peVar1->field_6).i != (peVar2->field_6).i)))) {
LAB_0012ba4e:
    mismatchattr[uVar9] = "pixelAspectRatio";
    uVar9 = (ulong)((int)uVar9 + 1);
  }
  local_38 = mismatchcount;
  eVar5 = exr_get_attribute_by_name(ctxt,0,"timecode",&battr);
  eVar6 = exr_get_attribute_by_name(ctxt,curpartidx,"timecode",&cattr);
  if (eVar5 == 0 && eVar6 == 0) {
    if (((battr->type != EXR_ATTR_TIMECODE) || (cattr->type != EXR_ATTR_TIMECODE)) ||
       (((battr->field_6).box2i)->min != ((cattr->field_6).box2i)->min)) {
LAB_0012bab9:
      mismatchattr[uVar9] = "timecode";
      uVar9 = (ulong)((int)uVar9 + 1);
    }
  }
  else if (eVar6 == 0) goto LAB_0012bab9;
  iVar8 = (int)uVar9;
  eVar5 = exr_get_attribute_by_name(ctxt,0,"chromaticities",&battr);
  eVar6 = exr_get_attribute_by_name(ctxt,curpartidx,"chromaticities",&cattr);
  if (eVar5 == 0 && eVar6 == 0) {
    if (((battr->type == EXR_ATTR_CHROMATICITIES) && (cattr->type == EXR_ATTR_CHROMATICITIES)) &&
       (iVar7 = bcmp((battr->field_6).box2i,(cattr->field_6).box2i,0x20), iVar7 == 0))
    goto LAB_0012bb29;
  }
  else if (eVar6 != 0) goto LAB_0012bb29;
  iVar8 = iVar8 + 1;
  mismatchattr[uVar9] = "chromaticities";
LAB_0012bb29:
  *local_38 = iVar8;
  return (uint)(iVar8 != 0) << 4;
}

Assistant:

exr_result_t
internal_exr_validate_shared_attrs (exr_context_t ctxt,
                                    exr_priv_part_t basepart,
                                    exr_priv_part_t curpart,
                                    int curpartidx,
                                    const char **mismatchattr,
                                    int *mismatchcount)
{
    exr_result_t rv, rv1;
    const exr_attribute_t *battr, *cattr;
    int misidx = 0;

    rv = EXR_ERR_SUCCESS;
    if (basepart->displayWindow)
    {
        if (curpart->displayWindow)
        {
            if (basepart->displayWindow->type != EXR_ATTR_BOX2I ||
                basepart->displayWindow->type !=
                curpart->displayWindow->type)
            {
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
            }
            else if (memcmp (basepart->displayWindow->box2i,
                             curpart->displayWindow->box2i,
                             sizeof(exr_attr_box2i_t)))
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    }
    else if (curpart->displayWindow)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;

    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = EXR_REQ_DISP_STR;

    rv = EXR_ERR_SUCCESS;
    if (basepart->pixelAspectRatio)
    {
        if (curpart->pixelAspectRatio)
        {
            if (basepart->pixelAspectRatio->type != EXR_ATTR_FLOAT ||
                basepart->pixelAspectRatio->type !=
                curpart->pixelAspectRatio->type)
            {
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
            }
            else if (memcmp (&(basepart->pixelAspectRatio->f),
                             &(curpart->pixelAspectRatio->f),
                             sizeof(float)))
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    }
    else if (curpart->pixelAspectRatio)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = EXR_REQ_PAR_STR;

    rv = exr_get_attribute_by_name (ctxt, 0, "timecode", &battr);
    rv1 = exr_get_attribute_by_name (ctxt, curpartidx, "timecode", &cattr);
    if (EXR_ERR_SUCCESS == rv && rv == rv1)
    {
        if (battr->type != EXR_ATTR_TIMECODE ||
            battr->type != cattr->type)
        {
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else if (memcmp (battr->timecode,
                         cattr->timecode,
                         sizeof(exr_attr_timecode_t)))
        {
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else
            rv = EXR_ERR_SUCCESS;
    }
    else if (EXR_ERR_SUCCESS == rv1)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    else
        rv = EXR_ERR_SUCCESS; // both missing, ok
    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = "timecode";

    rv = exr_get_attribute_by_name (ctxt, 0, "chromaticities", &battr);
    rv1 = exr_get_attribute_by_name (ctxt, curpartidx, "chromaticities", &cattr);
    if (EXR_ERR_SUCCESS == rv && rv == rv1)
    {
        if (battr->type != EXR_ATTR_CHROMATICITIES ||
            battr->type != cattr->type)
        {
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else if (memcmp (battr->chromaticities,
                         cattr->chromaticities,
                         sizeof(exr_attr_chromaticities_t)))
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        else
            rv = EXR_ERR_SUCCESS;
    }
    else if (EXR_ERR_SUCCESS == rv1)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    else
        rv = EXR_ERR_SUCCESS; // both missing, ok
    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = "chromaticities";

    *mismatchcount = misidx;
    return misidx == 0 ? EXR_ERR_SUCCESS : EXR_ERR_ATTR_TYPE_MISMATCH;
}